

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::initialize<tinyusdz::Animatable<int>>
          (optional<tinyusdz::Animatable<int>> *this,Animatable<int> *value)

{
  if (*this != (optional<tinyusdz::Animatable<int>>)0x1) {
    tinyusdz::Animatable<int>::Animatable((Animatable<int> *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<int>>)0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<int>>::initialize(V &&) [T = tinyusdz::Animatable<int>, V = tinyusdz::Animatable<int>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }